

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
JsTTDGetPreviousSnapshotInterval
          (JsRuntimeHandle runtimeHandle,int64_t currentSnapStartTime,int64_t *previousSnapTime)

{
  EventLog *this;
  JsrtRuntime *pJVar1;
  int64 iVar2;
  
  pJVar1 = JsrtRuntime::FromHandle(runtimeHandle);
  this = pJVar1->threadContext->TTDLog;
  if (this != (EventLog *)0x0) {
    iVar2 = TTD::EventLog::GetPreviousSnapshotInterval(this,currentSnapStartTime);
    *previousSnapTime = iVar2;
    return JsNoError;
  }
  TTDAbort_unrecoverable_error("Should only happen in TT debugging mode.");
}

Assistant:

CHAKRA_API JsTTDGetPreviousSnapshotInterval(_In_ JsRuntimeHandle runtimeHandle, _In_ int64_t currentSnapStartTime, _Out_ int64_t* previousSnapTime)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);
    ThreadContext * threadContext = runtime->GetThreadContext();
    TTDAssert(threadContext->IsRuntimeInTTDMode(), "Should only happen in TT debugging mode.");

    *previousSnapTime = threadContext->TTDLog->GetPreviousSnapshotInterval(currentSnapStartTime);

    return JsNoError;
#endif
}